

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,void *value)

{
  void *in_RSI;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *in_RDI;
  char in_stack_ffffffffffffffe7;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *this_00;
  
  this_00 = in_RDI;
  if (in_RDI->specs_ != (format_specs *)0x0) {
    check_pointer_type_spec<char,fmt::v7::detail::error_handler>
              (in_stack_ffffffffffffffe7,(error_handler *)in_RDI);
  }
  write_pointer(this_00,in_RSI);
  return (iterator)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (in_RDI->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(const void* value) {
    if (specs_) check_pointer_type_spec(specs_->type, error_handler());
    write_pointer(value);
    return out_;
  }